

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrbitalElements.cc
# Opt level: O3

void __thiscall libsgp4::OrbitalElements::OrbitalElements(OrbitalElements *this,Tle *tle)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  (this->epoch_).m_encoded = 0;
  DateTime::Initialise(&this->epoch_,1,1,1,0,0,0,0);
  this->mean_anomoly_ = (tle->mean_anomaly_ * 3.141592653589793) / 180.0;
  this->ascending_node_ = (tle->right_ascending_node_ * 3.141592653589793) / 180.0;
  this->argument_perigee_ = (tle->argument_perigee_ * 3.141592653589793) / 180.0;
  this->eccentricity_ = tle->eccentricity_;
  auVar6._0_8_ = tle->inclination_ * 3.141592653589793;
  auVar6._8_8_ = tle->mean_motion_ * 6.283185307179586;
  auVar6 = divpd(auVar6,_DAT_0010a400);
  this->inclination_ = (double)auVar6._0_8_;
  this->mean_motion_ = (double)auVar6._8_8_;
  this->bstar_ = tle->bstar_;
  (this->epoch_).m_encoded = (tle->epoch_).m_encoded;
  dVar1 = pow(kXKE / auVar6._8_8_,0.6666666666666666);
  dVar2 = cos(this->inclination_);
  dVar5 = 1.0 - this->eccentricity_ * this->eccentricity_;
  if (dVar5 < 0.0) {
    dVar3 = sqrt(dVar5);
  }
  else {
    dVar3 = SQRT(dVar5);
  }
  dVar5 = ((dVar2 * dVar2 * 3.0 + -1.0) * 0.0008119620000000001) / (dVar3 * dVar5);
  dVar2 = dVar5 / (dVar1 * dVar1);
  auVar4._0_8_ = (1.0 - (((dVar2 * 134.0) / 81.0 + 1.0) * dVar2 + 0.3333333333333333) * dVar2) *
                 dVar1;
  dVar5 = dVar5 / (auVar4._0_8_ * auVar4._0_8_);
  auVar7._0_8_ = 1.0 - dVar5;
  auVar7._8_8_ = dVar5 + 1.0;
  auVar4._8_8_ = this->mean_motion_;
  auVar6 = divpd(auVar4,auVar7);
  this->recovered_semi_major_axis_ = (double)auVar6._0_8_;
  this->recovered_mean_motion_ = (double)auVar6._8_8_;
  this->perigee_ = ((1.0 - this->eccentricity_) * auVar6._0_8_ + -1.0) * 6378.135;
  this->period_ = 6.283185307179586 / auVar6._8_8_;
  return;
}

Assistant:

OrbitalElements::OrbitalElements(const Tle& tle)
{
    /*
     * extract and format tle data
     */
    mean_anomoly_ = tle.MeanAnomaly(false);
    ascending_node_ = tle.RightAscendingNode(false);
    argument_perigee_ = tle.ArgumentPerigee(false);
    eccentricity_ = tle.Eccentricity();
    inclination_ = tle.Inclination(false);
    mean_motion_ = tle.MeanMotion() * kTWOPI / kMINUTES_PER_DAY;
    bstar_ = tle.BStar();
    epoch_ = tle.Epoch();

    /*
     * recover original mean motion (xnodp) and semimajor axis (aodp)
     * from input elements
     */
    const double a1 = pow(kXKE / MeanMotion(), kTWOTHIRD);
    const double cosio = cos(Inclination());
    const double theta2 = cosio * cosio;
    const double x3thm1 = 3.0 * theta2 - 1.0;
    const double eosq = Eccentricity() * Eccentricity();
    const double betao2 = 1.0 - eosq;
    const double betao = sqrt(betao2);
    const double temp = (1.5 * kCK2) * x3thm1 / (betao * betao2);
    const double del1 = temp / (a1 * a1);
    const double a0 = a1 * (1.0 - del1 * (1.0 / 3.0 + del1 * (1.0 + del1 * 134.0 / 81.0)));
    const double del0 = temp / (a0 * a0);

    recovered_mean_motion_ = MeanMotion() / (1.0 + del0);
    /*
     * alternative way to calculate
     * doesnt affect final results
     * recovered_semi_major_axis_ = pow(XKE / RecoveredMeanMotion(), TWOTHIRD);
     */
    recovered_semi_major_axis_ = a0 / (1.0 - del0);

    /*
     * find perigee and period
     */
    perigee_ = (RecoveredSemiMajorAxis() * (1.0 - Eccentricity()) - kAE) * kXKMPER;
    period_ = kTWOPI / RecoveredMeanMotion();
}